

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# narpc_storage_client.cc
# Opt level: O2

Future<int> * __thiscall
NarpcStorageClient::ReadData
          (Future<int> *__return_storage_ptr__,NarpcStorageClient *this,int key,longlong address,
          shared_ptr<crail::ByteBuffer> *buf)

{
  element_type *peVar1;
  int iVar2;
  shared_ptr<NarpcReadResponse> response;
  shared_ptr<NarpcReadRequest> request;
  __shared_ptr<NarpcReadResponse,_(__gnu_cxx::_Lock_policy)2> local_90;
  __shared_ptr<NarpcReadRequest,_(__gnu_cxx::_Lock_policy)2> local_80;
  int local_6c;
  __shared_ptr<RpcMessage,(__gnu_cxx::_Lock_policy)2> local_68 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<RpcMessage,(__gnu_cxx::_Lock_policy)2> local_58 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<AsyncTask<int>,(__gnu_cxx::_Lock_policy)2> local_48 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  shared_ptr<crail::ByteBuffer> local_38;
  
  peVar1 = (buf->super___shared_ptr<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_90._M_ptr._0_4_ = peVar1->limit_ - peVar1->position_;
  local_6c = key;
  local_38.super___shared_ptr<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)address;
  std::make_shared<NarpcReadRequest,int&,long_long&,int>
            ((int *)&local_80,(longlong *)&local_6c,
             (int *)&local_38.super___shared_ptr<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount);
  local_38.super___shared_ptr<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&this->rpc_client_;
  std::make_shared<NarpcReadResponse,RpcClient*,std::shared_ptr<crail::ByteBuffer>&>
            ((RpcClient **)&local_90,&local_38);
  std::__shared_ptr<RpcMessage,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<NarpcReadRequest,void>
            (local_58,&local_80);
  std::__shared_ptr<RpcMessage,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<NarpcReadResponse,void>
            (local_68,&local_90);
  iVar2 = RpcClient::IssueRequest
                    (&this->rpc_client_,(shared_ptr<RpcMessage> *)local_58,
                     (shared_ptr<RpcMessage> *)local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
  if (iVar2 < 0) {
    (__return_storage_ptr__->super_AsyncTask<int>)._vptr_AsyncTask = (_func_int **)&PTR_get_0013b398
    ;
    (__return_storage_ptr__->task_).super___shared_ptr<AsyncTask<int>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    (__return_storage_ptr__->task_).super___shared_ptr<AsyncTask<int>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    __return_storage_ptr__->is_done_ = true;
    __return_storage_ptr__->result_ = -1;
  }
  else {
    std::__shared_ptr<AsyncTask<int>,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<NarpcReadResponse,void>(local_48,&local_90);
    Future<int>::Future(__return_storage_ptr__,(shared_ptr<AsyncTask<int>_> *)local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

Future<int> NarpcStorageClient::ReadData(int key, long long address,
                                         shared_ptr<ByteBuffer> buf) {
  shared_ptr<NarpcReadRequest> request =
      make_shared<NarpcReadRequest>(key, address, buf->remaining());
  shared_ptr<NarpcReadResponse> response =
      make_shared<NarpcReadResponse>(&rpc_client_, buf);

  if (rpc_client_.IssueRequest(request, response) < 0) {
    return Future<int>::Failure(-1);
  }
  return Future<int>(response);
}